

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O2

void Image_Function::Accumulate
               (Image *image,uint32_t x,uint32_t y,uint32_t width,uint32_t height,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *result)

{
  uint uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  pointer puVar4;
  imageException *this;
  uchar *puVar5;
  uchar *puVar6;
  uint uVar7;
  ulong uVar8;
  
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>(image,x,y,width,height);
  uVar1 = image->_rowSize;
  uVar7 = width * image->_colorCount;
  if (uVar1 == uVar7) {
    uVar3 = height;
    uVar2 = 1;
    if (uVar7 < 0xffffffff / height) {
      uVar3 = 1;
      uVar2 = height;
    }
    height = uVar3;
    uVar7 = uVar7 * uVar2;
  }
  puVar4 = (result->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)(result->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)puVar4 >> 2 != (ulong)(height * uVar7)) {
    this = (imageException *)__cxa_allocate_exception(0x28);
    imageException::imageException
              (this,"Array size is not equal to image ROI (width * height) size");
    __cxa_throw(this,&imageException::typeinfo,imageException::~imageException);
  }
  puVar5 = image->_data + (ulong)(image->_colorCount * x) + (ulong)(y * uVar1);
  puVar6 = puVar5 + height * uVar1;
  for (; puVar5 != puVar6; puVar5 = puVar5 + uVar1) {
    for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
      *puVar4 = *puVar4 + (uint)puVar5[uVar8];
      puVar4 = puVar4 + 1;
    }
  }
  return;
}

Assistant:

void Accumulate( const Image & image, uint32_t x, uint32_t y, uint32_t width, uint32_t height, std::vector < uint32_t > & result )
    {
        ParameterValidation( image, x, y, width, height );

        const uint8_t colorCount = image.colorCount();
        width = width * colorCount;

        OptimiseRoi( width, height, image );

        if( result.size() != width * height )
            throw imageException( "Array size is not equal to image ROI (width * height) size" );

        const uint32_t rowSize = image.rowSize();

        const uint8_t * imageY    = image.data() + y * rowSize + x * colorCount;
        const uint8_t * imageYEnd = imageY + height * rowSize;
        std::vector < uint32_t >::iterator v = result.begin();

        for( ; imageY != imageYEnd; imageY += rowSize ) {
            const uint8_t * imageX    = imageY;
            const uint8_t * imageXEnd = imageX + width;

            for( ; imageX != imageXEnd; ++imageX, ++v )
                *v += (*imageX);
        }
    }